

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcDataStream::write_at(CTcDataStream *this,ulong ofs,char *buf,size_t len)

{
  ulong uVar1;
  
  uVar1 = this->ofs_;
  if (uVar1 == ofs) {
    write(this,(int)buf,(void *)len,len);
    uVar1 = this->ofs_;
  }
  if (uVar1 < len + ofs) {
    CTcTokenizer::throw_internal_error(0x2cee);
  }
  if (len != 0) {
    do {
      uVar1 = 65000 - ofs % 65000;
      if (len <= uVar1) {
        uVar1 = len;
      }
      memcpy(this->pages_[ofs / 65000] + ofs % 65000,buf,uVar1);
      ofs = ofs + uVar1;
      buf = buf + uVar1;
      len = len - uVar1;
    } while (len != 0);
  }
  return;
}

Assistant:

void CTcDataStream::write_at(ulong ofs, const char *buf, size_t len)
{
    /* if we're writing to the current offset, use the normal writer */
    if (ofs == ofs_)
        write(buf, len);
    
    /* 
     *   log an internal error, and skip writing anything, if the desired
     *   range of offsets has not been previously written 
     */
    if (ofs + len > ofs_)
        G_tok->throw_internal_error(TCERR_WRITEAT_PAST_END);

    /* write the data to each page it spans */
    while (len != 0)
    {
        size_t cur;

        /* 
         *   determine how much is left on the page containing the current
         *   starting offset 
         */
        cur = TCCS_PAGE_SIZE - (ofs % TCCS_PAGE_SIZE);

        /* 
         *   figure out how much we can copy - copy the whole remaining
         *   size, but no more than the amount remaining on this page 
         */
        if (cur > len)
            cur = len;

        /* copy the data */
        memcpy(calc_addr(ofs), buf, cur);

        /* advance past this chunk */
        len -= cur;
        ofs += cur;
        buf += cur;
    }
}